

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O1

Msat_IntVec_t * Msat_IntVecDup(Msat_IntVec_t *pVec)

{
  int iVar1;
  int iVar2;
  Msat_IntVec_t *pMVar3;
  int *__dest;
  
  pMVar3 = (Msat_IntVec_t *)malloc(0x10);
  iVar1 = pVec->nSize;
  pMVar3->nSize = iVar1;
  iVar2 = pVec->nCap;
  pMVar3->nCap = iVar2;
  if ((long)iVar2 == 0) {
    __dest = (int *)0x0;
  }
  else {
    __dest = (int *)malloc((long)iVar2 << 2);
  }
  pMVar3->pArray = __dest;
  memcpy(__dest,pVec->pArray,(long)iVar1 << 2);
  return pMVar3;
}

Assistant:

Msat_IntVec_t * Msat_IntVecDup( Msat_IntVec_t * pVec )
{
    Msat_IntVec_t * p;
    p = ABC_ALLOC( Msat_IntVec_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(int) * pVec->nSize );
    return p;
}